

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number __thiscall
chaiscript::Boxed_Number::bitwise_complement(Boxed_Number *this,Boxed_Number *t_lhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Number BVar1;
  int local_3c;
  Boxed_Value local_38;
  Boxed_Number local_28;
  Boxed_Number *local_18;
  Boxed_Number *t_lhs_local;
  
  local_3c = 0;
  local_18 = t_lhs;
  t_lhs_local = this;
  Boxed_Value::Boxed_Value<int,void>(&local_38,&local_3c,false);
  oper(&local_28,bitwise_complement,&t_lhs->bv,&local_38);
  Boxed_Number(this,&local_28.bv);
  Boxed_Value::~Boxed_Value(&local_28.bv);
  Boxed_Value::~Boxed_Value(&local_38);
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar1.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static const Boxed_Number bitwise_complement(const Boxed_Number &t_lhs) {
      return Boxed_Number(oper(Operators::Opers::bitwise_complement, t_lhs.bv, Boxed_Value(0)));
    }